

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O0

ostringstream *
tinyusdz::fmt::detail::format_sv_rec<long,std::__cxx11::string>
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv,size_t idx,long *v,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  long *v_local;
  size_t idx_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sv_local;
  ostringstream *ss_local;
  
  sVar2 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(sv);
  if (idx < sVar2) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)sv,idx);
    bVar1 = ::std::operator==(__lhs,"{}");
    if (bVar1) {
      ::std::ostream::operator<<(ss,*v);
      format_sv_rec<std::__cxx11::string>
                ((ostringstream *)ss,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)sv,idx + 1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    }
    else {
      psVar3 = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)sv,idx);
      ::std::operator<<((ostream *)ss,psVar3);
      format_sv_rec<long,std::__cxx11::string>(ss,sv,idx + 1,v,args);
    }
  }
  return ss;
}

Assistant:

std::ostringstream &format_sv_rec(std::ostringstream &ss,
                                  const std::vector<std::string> &sv,
                                  size_t idx, T const &v, Rest const &...args) {
  if (idx >= sv.size()) {
    return ss;
  }

  if (sv[idx] == "{}") {
    ss << v;
    format_sv_rec(ss, sv, idx + 1, args...);
  } else {
    ss << sv[idx];
    format_sv_rec(ss, sv, idx + 1, v, args...);
  }

  return ss;
}